

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

drmp3_bool32
drmp3_init_internal(drmp3 *pMP3,drmp3_read_proc onRead,drmp3_seek_proc onSeek,void *pUserData,
                   drmp3_config *pConfig)

{
  uint uVar1;
  drmp3_uint32 dVar2;
  uint uVar3;
  
  (pMP3->decoder).header[0] = '\0';
  if (pConfig == (drmp3_config *)0x0) {
    dVar2 = 0xac44;
    uVar3 = 2;
  }
  else {
    uVar1 = pConfig->outputChannels;
    uVar3 = 2;
    if (uVar1 < 2) {
      uVar3 = uVar1;
    }
    dVar2 = 0xac44;
    if (pConfig->outputSampleRate != 0) {
      dVar2 = pConfig->outputSampleRate;
    }
    if (uVar1 == 0) {
      uVar3 = 2;
    }
  }
  pMP3->channels = uVar3;
  pMP3->sampleRate = dVar2;
  pMP3->onRead = onRead;
  pMP3->onSeek = onSeek;
  pMP3->pUserData = pUserData;
  memset(&pMP3->src,0,0x1448);
  if (uVar3 != 0) {
    (pMP3->src).config.sampleRateIn = 0xac44;
    (pMP3->src).config.sampleRateOut = dVar2;
    (pMP3->src).config.channels = uVar3;
    (pMP3->src).config.algorithm = drmp3_src_algorithm_linear;
    (pMP3->src).config.cacheSizeInFrames = 0x200;
    (pMP3->src).onRead = drmp3_read_src;
    (pMP3->src).pUserData = pMP3;
    (pMP3->src).cache.pSRC = &pMP3->src;
    (pMP3->src).cache.cachedFrameCount = 0;
    (pMP3->src).cache.iNextFrame = 0;
    dVar2 = drmp3_decode_next_frame_ex(pMP3,(drmp3d_sample_t *)pMP3->pcmFrames,0);
    if (dVar2 != 0) {
      return 1;
    }
  }
  drmp3_uninit(pMP3);
  return 0;
}

Assistant:

drmp3_bool32 drmp3_init_internal(drmp3* pMP3, drmp3_read_proc onRead, drmp3_seek_proc onSeek, void* pUserData, const drmp3_config* pConfig)
{
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(onRead != NULL);

    // This function assumes the output object has already been reset to 0. Do not do that here, otherwise things will break.
    drmp3dec_init(&pMP3->decoder);

    // The config can be null in which case we use defaults.
    drmp3_config config;
    if (pConfig != NULL) {
        config = *pConfig;
    } else {
        drmp3_zero_object(&config);
    }

    pMP3->channels = config.outputChannels;
    if (pMP3->channels == 0) {
        pMP3->channels = DR_MP3_DEFAULT_CHANNELS;
    }

    // Cannot have more than 2 channels.
    if (pMP3->channels > 2) {
        pMP3->channels = 2;
    }

    pMP3->sampleRate = config.outputSampleRate;
    if (pMP3->sampleRate == 0) {
        pMP3->sampleRate = DR_MP3_DEFAULT_SAMPLE_RATE;
    }

    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->pUserData = pUserData;

    // We need a sample rate converter for converting the sample rate from the MP3 frames to the requested output sample rate.
    drmp3_src_config srcConfig;
    drmp3_zero_object(&srcConfig);
    srcConfig.sampleRateIn = DR_MP3_DEFAULT_SAMPLE_RATE;
    srcConfig.sampleRateOut = pMP3->sampleRate;
    srcConfig.channels = pMP3->channels;
    srcConfig.algorithm = drmp3_src_algorithm_linear;
    if (!drmp3_src_init(&srcConfig, drmp3_read_src, pMP3, &pMP3->src)) {
        drmp3_uninit(pMP3);
        return DRMP3_FALSE;
    }

    // Decode the first frame to confirm that it is indeed a valid MP3 stream.
    if (!drmp3_decode_next_frame(pMP3)) {
        drmp3_uninit(pMP3);
        return DRMP3_FALSE; // Not a valid MP3 stream.
    }

    return DRMP3_TRUE;
}